

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::computeDualfarkas4Row
          (SPxSolverBase<double> *this,double direction,SPxId enterId)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  UpdateVector<double> *pUVar3;
  int iVar4;
  long lVar5;
  int siz;
  SPxId spxid;
  DataKey local_68;
  DataKey local_60;
  double local_58;
  ulong uStack_50;
  double local_40;
  DataKey local_38;
  
  local_58 = *(double *)(&DAT_00601180 + (ulong)(0.0 < direction) * 8);
  uStack_50 = 0;
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  iVar4 = (this->theFvec->thedelta).super_IdxSet.num + 1;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  local_60 = enterId.super_DataKey;
  spx_realloc<soplex::Nonzero<double>*>(&(this->dualFarkas).theelem,iVar4);
  pUVar3 = this->theFvec;
  (this->dualFarkas).super_SVectorBase<double>.m_elem = (this->dualFarkas).theelem;
  (this->dualFarkas).super_SVectorBase<double>.memsize = iVar4;
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  if (0 < (pUVar3->thedelta).super_IdxSet.num) {
    lVar5 = 0;
    do {
      local_68 = (this->super_SPxBasisBase<double>).theBaseId.data
                 [(pUVar3->thedelta).super_IdxSet.idx[lVar5]].super_DataKey;
      if (local_68.info < 0) {
        SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_68);
        iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                          (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                            super_SVSetBase<double>.set,&local_38);
        local_40 = (this->theFvec->thedelta).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->theFvec->thedelta).super_IdxSet.idx[lVar5]] * local_58;
        DSVectorBase<double>::makeMem(&this->dualFarkas,1);
        if ((local_40 != 0.0) || (NAN(local_40))) {
          iVar2 = (this->dualFarkas).super_SVectorBase<double>.memused;
          pNVar1 = (this->dualFarkas).super_SVectorBase<double>.m_elem;
          pNVar1[iVar2].idx = iVar4;
          pNVar1[iVar2].val = local_40;
          (this->dualFarkas).super_SVectorBase<double>.memused = iVar2 + 1;
        }
      }
      lVar5 = lVar5 + 1;
      pUVar3 = this->theFvec;
    } while (lVar5 < (pUVar3->thedelta).super_IdxSet.num);
  }
  if (local_60.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_68,(SPxId *)&local_60);
    iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_68);
    local_58 = -local_58;
    uStack_50 = uStack_50 ^ 0x8000000000000000;
    DSVectorBase<double>::makeMem(&this->dualFarkas,1);
    iVar4 = (this->dualFarkas).super_SVectorBase<double>.memused;
    pNVar1 = (this->dualFarkas).super_SVectorBase<double>.m_elem;
    pNVar1[iVar4].idx = iVar2;
    pNVar1[iVar4].val = local_58;
    (this->dualFarkas).super_SVectorBase<double>.memused = iVar4 + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}